

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

Instr * __thiscall IR::Instr::Clone(Instr *this)

{
  Func *pFVar1;
  Cloner *this_00;
  code *pcVar2;
  bool bVar3;
  uint32 offset;
  undefined4 *puVar4;
  PragmaInstr *this_01;
  JitProfilingInstr *this_02;
  LabelInstr *pLVar5;
  BranchInstr *this_03;
  ProfiledInstr *this_04;
  Opnd *pOVar6;
  
  if (this->m_kind - 1 < 10) {
    pFVar1 = this->m_func;
    this_00 = pFVar1->topFunc->m_cloner;
    switch((uint)this->m_kind) {
    case 1:
      pLVar5 = (LabelInstr *)CloneInstr(this);
      break;
    case 2:
      this_03 = AsBranchInstr(this);
      pLVar5 = (LabelInstr *)BranchInstr::CloneBranchInstr(this_03);
      break;
    case 3:
    case 5:
      pLVar5 = AsLabelInstr(this);
      pLVar5 = LabelInstr::CloneLabel(pLVar5,1);
      break;
    case 4:
      this_04 = AsProfiledInstr(this);
      pLVar5 = (LabelInstr *)ProfiledInstr::CloneProfiledInstr(this_04);
      break;
    default:
      goto switchD_004804e1_caseD_6;
    case 8:
      this_01 = AsPragmaInstr(this);
      pLVar5 = (LabelInstr *)PragmaInstr::CopyPragma(this_01);
      break;
    case 10:
      this_02 = AsJitProfilingInstr(this);
      pLVar5 = (LabelInstr *)JitProfilingInstr::CloneJitProfiling(this_02);
    }
    if (this->m_dst != (Opnd *)0x0) {
      pOVar6 = Opnd::CloneDef(this->m_dst,pFVar1);
      SetDst(&pLVar5->super_Instr,pOVar6);
    }
    if (this->m_src1 != (Opnd *)0x0) {
      pOVar6 = Opnd::CloneUse(this->m_src1,pFVar1);
      SetSrc1(&pLVar5->super_Instr,pOVar6);
      if (this->m_src2 != (Opnd *)0x0) {
        pOVar6 = Opnd::CloneUse(this->m_src2,pFVar1);
        SetSrc2(&pLVar5->super_Instr,pOVar6);
      }
    }
    pFVar1 = this->m_func->topFunc;
    if ((pFVar1->hasInstrNumber == false) && (pFVar1->maintainByteCodeOffset == true)) {
      offset = GetByteCodeOffset(this);
      SetByteCodeOffset(&pLVar5->super_Instr,offset);
    }
    *(ushort *)&(pLVar5->super_Instr).field_0x36 =
         *(ushort *)&(pLVar5->super_Instr).field_0x36 & 0xffef | *(ushort *)&this->field_0x36 & 0x10
    ;
    Cloner::AddInstr(this_00,this,&pLVar5->super_Instr);
  }
  else {
switchD_004804e1_caseD_6:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x295,"(0)","Clone of this instr kind NYI");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pLVar5 = (LabelInstr *)0x0;
  }
  return &pLVar5->super_Instr;
}

Assistant:

Instr *
Instr::Clone()
{
    Func * func = this->m_func;
    Cloner *cloner = func->GetCloner();
    IR::Instr * instrClone;
    IR::Opnd * opnd;

    switch (this->GetKind())
    {
    case InstrKindInstr:
        instrClone = this->CloneInstr();
        break;
    case InstrKindBranch:
        instrClone = this->AsBranchInstr()->CloneBranchInstr();
        break;
    case InstrKindProfiled:
        instrClone = this->AsProfiledInstr()->CloneProfiledInstr();
        break;
    case InstrKindLabel:
    case InstrKindProfiledLabel:
        instrClone = this->AsLabelInstr()->CloneLabel(true);
        break;
    case InstrKindPragma:
        instrClone = this->AsPragmaInstr()->ClonePragma();
        break;
    case InstrKindJitProfiling:
        instrClone = this->AsJitProfilingInstr()->CloneJitProfiling();
        break;
    default:
        AssertMsg(0, "Clone of this instr kind NYI");
        return nullptr;
    }

    opnd = this->GetDst();
    if (opnd)
    {
        instrClone->SetDst(opnd->CloneDef(func));
    }
    opnd = this->GetSrc1();
    if (opnd)
    {
        instrClone->SetSrc1(opnd->CloneUse(func));
        opnd = this->GetSrc2();
        if (opnd)
        {
            instrClone->SetSrc2(opnd->CloneUse(func));
        }
    }
    if (this->m_func->DoMaintainByteCodeOffset())
    {
        instrClone->SetByteCodeOffset(this->GetByteCodeOffset());
    }
    instrClone->usesStackArgumentsObject = this->usesStackArgumentsObject;
    cloner->AddInstr(this, instrClone);

    return instrClone;
}